

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void gamma_end(png_structp ppIn,png_infop pi)

{
  png_store *ppVar1;
  gamma_display *dp_00;
  gamma_display *dp;
  png_const_structp pp;
  png_infop pi_local;
  png_structp ppIn_local;
  
  dp_00 = (gamma_display *)png_get_progressive_ptr(ppIn);
  if ((dp_00->this).speed == 0) {
    gamma_image_validate(dp_00,ppIn,pi);
  }
  else {
    ppVar1 = (dp_00->this).ps;
    ppVar1->field_0x18 = ppVar1->field_0x18 & 0x7f | 0x80;
  }
  return;
}

Assistant:

static void PNGCBAPI
gamma_end(png_structp ppIn, png_infop pi)
{
   png_const_structp pp = ppIn;
   gamma_display *dp = voidcast(gamma_display*, png_get_progressive_ptr(pp));

   if (!dp->this.speed)
      gamma_image_validate(dp, pp, pi);
   else
      dp->this.ps->validated = 1;
}